

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

uint __thiscall Thread::join(Thread *this)

{
  code *pcVar1;
  int iVar2;
  void *retval;
  
  if (this->thread == (void *)0x0) {
    retval._0_4_ = 0;
  }
  else {
    iVar2 = pthread_join((pthread_t)this->thread,&retval);
    if (iVar2 != 0) {
      iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Thread.cpp"
                            ,0x61,"pthread_join((pthread_t)thread, &retval) == 0");
      if (iVar2 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    this->thread = (void *)0x0;
  }
  return (uint)retval;
}

Assistant:

uint Thread::join()
{
  if(!thread)
    return 0;
#ifdef _WIN32
  VERIFY(WaitForSingleObject(thread, INFINITE) == WAIT_OBJECT_0);
  DWORD exitCode;
  VERIFY(GetExitCodeThread(thread, &exitCode));
  VERIFY(CloseHandle(thread));
  thread = 0;
  //threadId = 0;
  return exitCode;
#else
  void* retval;
  VERIFY(pthread_join((pthread_t)thread, &retval) == 0);
  thread = 0;
  return (uint)(intptr_t)retval;
#endif
}